

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

char * ures_getVersionNumberInternal_63(UResourceBundle *resourceBundle)

{
  UChar *us;
  char *pcVar1;
  int local_34;
  UChar *minor_version;
  int32_t local_20;
  int32_t len;
  int32_t minor_len;
  UErrorCode status;
  UResourceBundle *resourceBundle_local;
  
  if (resourceBundle == (UResourceBundle *)0x0) {
    resourceBundle_local = (UResourceBundle *)0x0;
  }
  else {
    _minor_len = resourceBundle;
    if (resourceBundle->fVersion == (char *)0x0) {
      len = 0;
      local_20 = 0;
      us = ures_getStringByKey_63(resourceBundle,"Version",&local_20,&len);
      if (local_20 < 1) {
        local_34 = 1;
      }
      else {
        local_34 = local_20;
      }
      pcVar1 = (char *)uprv_malloc_63((long)(local_34 + 1));
      _minor_len->fVersion = pcVar1;
      if (_minor_len->fVersion == (char *)0x0) {
        return (char *)0x0;
      }
      if (local_20 < 1) {
        strcpy(_minor_len->fVersion,"0");
      }
      else {
        u_UCharsToChars_63(us,_minor_len->fVersion,local_20);
        _minor_len->fVersion[local_34] = '\0';
      }
    }
    resourceBundle_local = (UResourceBundle *)_minor_len->fVersion;
  }
  return (char *)resourceBundle_local;
}

Assistant:

U_INTERNAL const char* U_EXPORT2 
ures_getVersionNumberInternal(const UResourceBundle *resourceBundle)
{
    if (!resourceBundle) return NULL;

    if(resourceBundle->fVersion == NULL) {

        /* If the version ID has not been built yet, then do so.  Retrieve */
        /* the minor version from the file. */
        UErrorCode status = U_ZERO_ERROR;
        int32_t minor_len = 0;
        int32_t len;

        const UChar* minor_version = ures_getStringByKey(resourceBundle, kVersionTag, &minor_len, &status);
        
        /* Determine the length of of the final version string.  This is */
        /* the length of the major part + the length of the separator */
        /* (==1) + the length of the minor part (+ 1 for the zero byte at */
        /* the end). */

        len = (minor_len > 0) ? minor_len : 1;
    
        /* Allocate the string, and build it up. */
        /* + 1 for zero byte */


        ((UResourceBundle *)resourceBundle)->fVersion = (char *)uprv_malloc(1 + len); 
        /* Check for null pointer. */
        if (((UResourceBundle *)resourceBundle)->fVersion == NULL) {
            return NULL;
        }
       
        if(minor_len > 0) {
            u_UCharsToChars(minor_version, resourceBundle->fVersion , minor_len);
            resourceBundle->fVersion[len] =  '\0';
        }
        else {
            uprv_strcpy(resourceBundle->fVersion, kDefaultMinorVersion);
        }
    }

    return resourceBundle->fVersion;
}